

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O1

Node * __thiscall
mapbox::detail::Earcut<unsigned_int>::findHoleBridge
          (Earcut<unsigned_int> *this,Node *hole,Node *outerNode)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  Node *pNVar6;
  Node *pNVar7;
  Node *pNVar8;
  Node *unaff_R15;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double local_80;
  
  dVar1 = hole->x;
  dVar2 = hole->y;
  dVar13 = -INFINITY;
  pNVar8 = (Node *)0x0;
  pNVar6 = outerNode;
  do {
    dVar3 = pNVar6->y;
    if (dVar2 <= dVar3) {
      pNVar7 = pNVar6->next;
      dVar14 = pNVar7->y;
      if (dVar14 <= dVar2) {
        if ((dVar14 != dVar3) || (NAN(dVar14) || NAN(dVar3))) {
          dVar4 = pNVar6->x;
          dVar9 = ((pNVar7->x - dVar4) * (dVar2 - dVar3)) / (dVar14 - dVar3) + dVar4;
          bVar5 = true;
          if ((dVar9 <= dVar1) && (dVar13 < dVar9)) {
            dVar13 = dVar9;
            if ((dVar9 != dVar1) || (NAN(dVar9) || NAN(dVar1))) {
LAB_0014a406:
              pNVar8 = pNVar7;
              if (dVar4 < pNVar7->x) {
                pNVar8 = pNVar6;
              }
            }
            else if ((dVar2 != dVar3) || (NAN(dVar2) || NAN(dVar3))) {
              if ((dVar2 != dVar14) || (NAN(dVar2) || NAN(dVar14))) goto LAB_0014a406;
              bVar5 = false;
              unaff_R15 = pNVar7;
            }
            else {
              bVar5 = false;
              unaff_R15 = pNVar6;
            }
          }
          if (!bVar5) {
            return unaff_R15;
          }
        }
      }
    }
    pNVar6 = pNVar6->next;
  } while (pNVar6 != outerNode);
  if (pNVar8 == (Node *)0x0) {
    pNVar6 = (Node *)0x0;
  }
  else {
    pNVar6 = pNVar8;
    if ((dVar1 != dVar13) || (NAN(dVar1) || NAN(dVar13))) {
      dVar3 = pNVar8->y;
      dVar14 = dVar13;
      if (dVar3 <= dVar2) {
        dVar14 = dVar1;
      }
      dVar4 = pNVar8->x;
      local_80 = INFINITY;
      pNVar7 = pNVar8;
      do {
        dVar9 = pNVar7->x;
        if ((((dVar1 != dVar9) || (NAN(dVar1) || NAN(dVar9))) && (dVar9 <= dVar1)) &&
           (dVar4 <= dVar9)) {
          dVar15 = dVar2 - pNVar7->y;
          dVar10 = (double)(~-(ulong)(dVar2 < dVar3) & (ulong)dVar13 |
                           -(ulong)(dVar2 < dVar3) & (ulong)dVar1) - dVar9;
          if (0.0 <= (dVar14 - dVar9) * dVar15 - dVar15 * dVar10) {
            dVar12 = dVar3 - pNVar7->y;
            dVar11 = (dVar4 - dVar9) * dVar15;
            if (((0.0 <= dVar10 * dVar12 - dVar11) && (0.0 <= dVar11 - dVar12 * (dVar14 - dVar9)))
               && (bVar5 = locallyInside(this,pNVar7,hole), bVar5)) {
              dVar9 = ABS(dVar15) / (dVar1 - dVar9);
              if (local_80 <= dVar9) {
                if (((dVar9 != local_80) || (NAN(dVar9) || NAN(local_80))) ||
                   ((pNVar7->x < pNVar6->x || pNVar7->x == pNVar6->x &&
                    (bVar5 = sectorContainsSector(this,pNVar6,pNVar7), !bVar5)))) goto LAB_0014a67c;
              }
              pNVar6 = pNVar7;
              local_80 = dVar9;
            }
          }
        }
LAB_0014a67c:
        pNVar7 = pNVar7->next;
      } while (pNVar7 != pNVar8);
    }
  }
  return pNVar6;
}

Assistant:

typename Earcut<N>::Node*
Earcut<N>::findHoleBridge(Node* hole, Node* outerNode) {
    Node* p = outerNode;
    double hx = hole->x;
    double hy = hole->y;
    double qx = -std::numeric_limits<double>::infinity();
    Node* m = nullptr;

    // find a segment intersected by a ray from the hole's leftmost Vertex to the left;
    // segment's endpoint with lesser x will be potential connection Vertex
    do {
        if (hy <= p->y && hy >= p->next->y && p->next->y != p->y) {
          double x = p->x + (hy - p->y) * (p->next->x - p->x) / (p->next->y - p->y);
          if (x <= hx && x > qx) {
            qx = x;
            if (x == hx) {
                if (hy == p->y) return p;
                if (hy == p->next->y) return p->next;
            }
            m = p->x < p->next->x ? p : p->next;
          }
        }
        p = p->next;
    } while (p != outerNode);

    if (!m) return 0;

    if (hx == qx) return m; // hole touches outer segment; pick leftmost endpoint

    // look for points inside the triangle of hole Vertex, segment intersection and endpoint;
    // if there are no points found, we have a valid connection;
    // otherwise choose the Vertex of the minimum angle with the ray as connection Vertex

    const Node* stop = m;
    double tanMin = std::numeric_limits<double>::infinity();
    double tanCur = 0;

    p = m;
    double mx = m->x;
    double my = m->y;

    do {
        if (hx >= p->x && p->x >= mx && hx != p->x &&
            pointInTriangle(hy < my ? hx : qx, hy, mx, my, hy < my ? qx : hx, hy, p->x, p->y)) {

            tanCur = std::abs(hy - p->y) / (hx - p->x); // tangential

            if (locallyInside(p, hole) &&
                (tanCur < tanMin || (tanCur == tanMin && (p->x > m->x || sectorContainsSector(m, p))))) {
                m = p;
                tanMin = tanCur;
            }
        }

        p = p->next;
    } while (p != stop);

    return m;
}